

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_helper.c
# Opt level: O2

void arm_debug_excp_handler_aarch64(CPUState *cs)

{
  CPUARMState_conflict *env;
  uint uVar1;
  CPUWatchpoint *pCVar2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  uint32_t uVar6;
  uint32_t target_el;
  uint32_t syndrome;
  TranslationBlock *pc;
  
  env = (CPUARMState_conflict *)(cs[1].tb_jmp_cache + 0x40b);
  pCVar2 = cs->watchpoint_hit;
  if (pCVar2 == (CPUWatchpoint *)0x0) {
    if (*(int *)((long)cs[1].tb_jmp_cache + 0x21a4) == 0) {
      pc = (TranslationBlock *)(ulong)*(uint *)((long)cs[1].tb_jmp_cache + 0x2094);
    }
    else {
      pc = cs[1].tb_jmp_cache[0x433];
    }
    iVar4 = arm_debug_target_el(env);
    iVar5 = arm_current_el(env);
    _Var3 = cpu_breakpoint_test(cs,(vaddr)pc,0x10);
    if (!_Var3) {
      _Var3 = cpu_breakpoint_test(cs,(vaddr)pc,0x20);
      if (_Var3) {
        uVar6 = arm_debug_exception_fsr(env);
        *(uint32_t *)((long)cs[1].tb_jmp_cache + 0x2c2c) = uVar6;
        cs[1].tb_jmp_cache[0x586] = (TranslationBlock *)0x0;
        syndrome = (uint)(iVar4 == iVar5) << 0x1a | 0xc2000022;
        target_el = arm_debug_target_el(env);
        uVar6 = 3;
        goto LAB_005a21ac;
      }
    }
  }
  else {
    uVar1 = pCVar2->flags;
    if ((uVar1 & 0x20) != 0) {
      iVar4 = arm_debug_target_el(env);
      iVar5 = arm_current_el(env);
      cs->watchpoint_hit = (CPUWatchpoint *)0x0;
      uVar6 = arm_debug_exception_fsr(env);
      *(uint32_t *)((long)cs[1].tb_jmp_cache + 0x2c2c) = uVar6;
      cs[1].tb_jmp_cache[0x586] = (TranslationBlock *)pCVar2->hitaddr;
      syndrome = (uVar1 >> 1 & 0x40) + (uint)(iVar4 == iVar5) * 0x4000000 + 0xd2000022;
      target_el = arm_debug_target_el(env);
      uVar6 = 4;
LAB_005a21ac:
      raise_exception_aarch64(env,uVar6,syndrome,target_el);
    }
  }
  return;
}

Assistant:

void arm_debug_excp_handler(CPUState *cs)
{
    /*
     * Called by core code when a watchpoint or breakpoint fires;
     * need to check which one and raise the appropriate exception.
     */
    ARMCPU *cpu = ARM_CPU(cs);
    CPUARMState *env = &cpu->env;
    CPUWatchpoint *wp_hit = cs->watchpoint_hit;

    if (wp_hit) {
        if (wp_hit->flags & BP_CPU) {
            bool wnr = (wp_hit->flags & BP_WATCHPOINT_HIT_WRITE) != 0;
            bool same_el = arm_debug_target_el(env) == arm_current_el(env);

            cs->watchpoint_hit = NULL;

            env->exception.fsr = arm_debug_exception_fsr(env);
            env->exception.vaddress = wp_hit->hitaddr;
            raise_exception(env, EXCP_DATA_ABORT,
                    syn_watchpoint(same_el, 0, wnr),
                    arm_debug_target_el(env));
        }
    } else {
        uint64_t pc = is_a64(env) ? env->pc : env->regs[15];
        bool same_el = (arm_debug_target_el(env) == arm_current_el(env));

        /*
         * (1) GDB breakpoints should be handled first.
         * (2) Do not raise a CPU exception if no CPU breakpoint has fired,
         * since singlestep is also done by generating a debug internal
         * exception.
         */
        if (cpu_breakpoint_test(cs, pc, BP_GDB)
            || !cpu_breakpoint_test(cs, pc, BP_CPU)) {
            return;
        }

        env->exception.fsr = arm_debug_exception_fsr(env);
        /*
         * FAR is UNKNOWN: clear vaddress to avoid potentially exposing
         * values to the guest that it shouldn't be able to see at its
         * exception/security level.
         */
        env->exception.vaddress = 0;
        raise_exception(env, EXCP_PREFETCH_ABORT,
                        syn_breakpoint(same_el),
                        arm_debug_target_el(env));
    }
}